

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,string_view name,SourceLocation externalLoc,
          PortConcatenationSyntax *syntax)

{
  PortReferenceSyntax *syntax_00;
  int *piVar1;
  Scope *pSVar2;
  Compilation *this_00;
  bool bVar3;
  int iVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  SourceLocation SVar6;
  Symbol *pSVar7;
  Diagnostic *pDVar8;
  undefined4 extraout_var;
  MultiPortSymbol *pMVar9;
  EVP_PKEY_CTX *pEVar10;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  Info *extraout_RDX_07;
  long lVar11;
  DiagCode code;
  ulong uVar12;
  SourceRange SVar13;
  ArgumentDirection dir;
  SmallVector<const_slang::ast::PortSymbol_*,_5UL> buffer;
  ArgumentDirection local_b8;
  uint local_b4;
  ulong local_b0;
  NonAnsiPortListBuilder *local_a8;
  PortConcatenationSyntax *local_a0;
  Token local_98;
  SourceLocation local_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  SmallVectorBase<const_slang::ast::PortSymbol_*> local_70 [2];
  
  pEVar10 = (EVP_PKEY_CTX *)name._M_str;
  local_80._M_len = name._M_len;
  local_b8 = In;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  uVar12 = (syntax->references).elements._M_extent._M_extent_value + 1;
  local_a0 = syntax;
  local_88 = externalLoc;
  local_80._M_str = (char *)pEVar10;
  if (1 < uVar12) {
    uVar12 = uVar12 >> 1;
    bVar3 = true;
    lVar11 = 0;
    local_b4 = (uint)CONCAT71((int7)((ulong)local_70[0].data_ >> 8),1);
    local_b0 = 0;
    local_a8 = this;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((local_a0->references).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar11));
      syntax_00 = (PortReferenceSyntax *)*ppSVar5;
      local_98 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax_00);
      SVar6 = parsing::Token::location(&local_98);
      pSVar7 = createPort(this,(string_view)(ZEXT816(0x533172) << 0x40),SVar6,syntax_00);
      if (pSVar7->kind == Port) {
        piVar1 = *(int **)(pSVar7 + 1);
        pEVar10 = extraout_RDX;
        this = local_a8;
        if (piVar1 != (int *)0x0) {
          local_98._0_8_ = pSVar7;
          SmallVectorBase<slang::ast::PortSymbol_const*>::
          emplace_back<slang::ast::PortSymbol_const*>
                    ((SmallVectorBase<slang::ast::PortSymbol_const*> *)local_70,
                     (PortSymbol **)&local_98);
          pSVar2 = local_a8->scope;
          pSVar7->parentScope = pSVar2;
          iVar4 = *(int *)&pSVar7[1].name._M_str;
          pEVar10 = extraout_RDX_00;
          if (iVar4 == 3) {
            local_b8 = Ref;
            if (((local_b4 & 1) == 0) && ((local_b0 & 1) == 0)) {
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_a0);
              SVar6 = SVar13.endLoc;
              code.subsystem = Declarations;
              code.code = 0x9c;
LAB_0037c8a1:
              local_b0 = CONCAT71(SVar13.endLoc._1_7_,1);
              SVar13.endLoc = SVar6;
              SVar13.startLoc = SVar13.startLoc;
              Scope::addDiag(pSVar2,code,SVar13);
              pEVar10 = extraout_RDX_02;
            }
          }
          else if (iVar4 == 2) {
            local_b8 = InOut;
            if ((!bVar3) && ((local_b0 & 1) == 0)) {
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_a0);
              SVar6 = SVar13.endLoc;
              code.subsystem = Declarations;
              code.code = 0x9b;
              goto LAB_0037c8a1;
            }
          }
          else if ((iVar4 == 1) && (local_b8 == In)) {
            local_b8 = Out;
          }
          if (*piVar1 == 0x3b) {
            if ((local_b8 == Ref) && ((local_b0 & 1) == 0)) {
              pSVar2 = local_a8->scope;
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_a0);
              local_b0 = CONCAT71(SVar13.endLoc._1_7_,1);
              Scope::addDiag(pSVar2,(DiagCode)0x9c0006,SVar13);
              pEVar10 = extraout_RDX_03;
            }
            this = local_a8;
            if (*(int *)(*(long *)(piVar1 + 0x54) + 0x80) == 0xd) {
              pSVar2 = local_a8->scope;
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
              Scope::addDiag(pSVar2,(DiagCode)0x510006,SVar13);
              pEVar10 = extraout_RDX_05;
            }
            else if (*(int *)(*(long *)(piVar1 + 0x54) + 0x80) == 0xc) {
              if ((local_b8 == InOut) && ((local_b0 & 1) == 0)) {
                pSVar2 = local_a8->scope;
                SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_a0);
                pDVar8 = Scope::addDiag(pSVar2,(DiagCode)0x9b0006,SVar13);
                local_b0 = CONCAT71((int7)((ulong)pDVar8 >> 8),1);
                pEVar10 = extraout_RDX_04;
              }
              local_b4 = 0;
              goto LAB_0037c97d;
            }
            local_b4 = 0;
          }
          else {
            if (local_b8 == InOut) {
              this = local_a8;
              if ((local_b0 & 1) != 0) {
LAB_0037c97d:
                bVar3 = false;
                goto LAB_0037c9ea;
              }
              pSVar2 = local_a8->scope;
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_a0);
              pDVar8 = Scope::addDiag(pSVar2,(DiagCode)0x9b0006,SVar13);
              local_b0 = CONCAT71((int7)((ulong)pDVar8 >> 8),1);
              pEVar10 = extraout_RDX_06;
            }
            bVar3 = false;
            this = local_a8;
          }
        }
      }
      else {
        pSVar2 = this->scope;
        SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
        pDVar8 = Scope::addDiag(pSVar2,(DiagCode)0x450006,SVar13);
        Diagnostic::operator<<(pDVar8,pSVar7->name);
        pEVar10 = extraout_RDX_01;
      }
LAB_0037c9ea:
      lVar11 = lVar11 + 0x30;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  this_00 = this->comp;
  iVar4 = SmallVectorBase<const_slang::ast::PortSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)this_00,pEVar10);
  local_98.rawLen = extraout_var;
  local_98.kind = (short)iVar4;
  local_98._2_1_ = (char)((uint)iVar4 >> 0x10);
  local_98.numFlags.raw = (char)((uint)iVar4 >> 0x18);
  local_98.info = extraout_RDX_07;
  pMVar9 = BumpAllocator::
           emplace<slang::ast::MultiPortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::PortSymbol_const*,18446744073709551615ul>,slang::ast::ArgumentDirection&>
                     (&this_00->super_BumpAllocator,&local_80,&local_88,
                      (span<const_slang::ast::PortSymbol_*,_18446744073709551615UL> *)&local_98,
                      &local_b8);
  (pMVar9->super_Symbol).originatingSyntax = (SyntaxNode *)local_a0;
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return &pMVar9->super_Symbol;
}

Assistant:

Symbol& createPort(std::string_view name, SourceLocation externalLoc,
                       const PortConcatenationSyntax& syntax) {
        ArgumentDirection dir = ArgumentDirection::In;
        SmallVector<const PortSymbol*> buffer;
        bool allNets = true;
        bool allVars = true;
        bool hadError = false;

        auto reportDirError = [&](DiagCode code) {
            if (!hadError) {
                scope.addDiag(code, syntax.sourceRange());
                hadError = true;
            }
        };

        for (auto item : syntax.references) {
            auto& port = createPort(""sv, item->getFirstToken().location(), *item);
            if (port.kind == SymbolKind::Port) {
                auto& ps = port.as<PortSymbol>();
                auto sym = ps.internalSymbol;
                if (!sym)
                    continue;

                buffer.push_back(&ps);
                ps.setParent(scope);

                // We need to merge the port direction with all of the other component port
                // directions to come up with our "effective" direction, which is what we use
                // to create connection expressions. The rules here are not spelled out in the
                // LRM, but here's what I think makes sense based on other language rules:
                // - If all the directions are the same, that's the effective direction.
                // - inputs and outputs can be freely mixed; output direction dominates.
                // - if any port is ref, all ports must be variables. Effective direction is ref.
                // - if any port is inout, all ports must be nets. Effective direction is inout.
                // - ref and inout can never mix (implied by above two points).
                if (ps.direction == ArgumentDirection::InOut) {
                    dir = ArgumentDirection::InOut;
                    if (!allNets)
                        reportDirError(diag::PortConcatInOut);
                }
                else if (ps.direction == ArgumentDirection::Ref) {
                    dir = ArgumentDirection::Ref;
                    if (!allVars)
                        reportDirError(diag::PortConcatRef);
                }
                else if (ps.direction == ArgumentDirection::Out && dir == ArgumentDirection::In) {
                    dir = ArgumentDirection::Out;
                }

                if (sym->kind == SymbolKind::Net) {
                    allVars = false;
                    if (dir == ArgumentDirection::Ref)
                        reportDirError(diag::PortConcatRef);

                    auto& net = sym->as<NetSymbol>();
                    if (net.netType.netKind == NetType::UWire) {
                        // UWire nets aren't resolvable nets and so act like variables
                        // for the purposes of these checks.
                        allNets = false;
                        if (dir == ArgumentDirection::InOut)
                            reportDirError(diag::PortConcatInOut);
                    }
                    else if (net.netType.netKind == NetType::Interconnect) {
                        // Can't use interconnects in a port concat.
                        scope.addDiag(diag::InterconnectMultiPort, item->sourceRange());
                    }
                }
                else {
                    allNets = false;
                    if (dir == ArgumentDirection::InOut)
                        reportDirError(diag::PortConcatInOut);
                }
            }
            else {
                auto& diag = scope.addDiag(diag::IfacePortInExpr, item->sourceRange());
                diag << port.name;
            }
        }

        auto result = comp.emplace<MultiPortSymbol>(name, externalLoc, buffer.copy(comp), dir);
        result->setSyntax(syntax);
        return *result;
    }